

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * QByteArray::fromHex(QByteArray *hexEncoded)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  qsizetype qVar5;
  long lVar6;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  int tmp;
  uchar ch;
  qsizetype i;
  bool odd_digit;
  uchar *result;
  QByteArray *res;
  QByteArray *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffb8;
  Initialization IVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QByteArray *in_stack_ffffffffffffffc8;
  byte *local_20;
  
  IVar7 = (Initialization)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  size(in_RSI);
  QByteArray(in_stack_ffffffffffffffc8,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
             ,IVar7);
  pcVar4 = data((QByteArray *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  qVar5 = size(in_RDI);
  local_20 = (byte *)(pcVar4 + qVar5);
  bVar1 = true;
  lVar6 = size(in_RSI);
  while (lVar6 = lVar6 + -1, -1 < lVar6) {
    bVar2 = at(in_stack_ffffffffffffff98,0x4ba262);
    iVar3 = QtMiscUtils::fromHex((uint)bVar2);
    if (iVar3 != -1) {
      bVar1 = !bVar1;
      if (bVar1) {
        *local_20 = *local_20 | (byte)(iVar3 << 4);
      }
      else {
        local_20 = local_20 + -1;
        *local_20 = (byte)iVar3;
      }
    }
  }
  constData((QByteArray *)0x4ba311);
  remove(in_RDI,(char *)0x0);
  return in_RDI;
}

Assistant:

QByteArray QByteArray::fromHex(const QByteArray &hexEncoded)
{
    QByteArray res((hexEncoded.size() + 1)/ 2, Qt::Uninitialized);
    uchar *result = (uchar *)res.data() + res.size();

    bool odd_digit = true;
    for (qsizetype i = hexEncoded.size() - 1; i >= 0; --i) {
        uchar ch = uchar(hexEncoded.at(i));
        int tmp = QtMiscUtils::fromHex(ch);
        if (tmp == -1)
            continue;
        if (odd_digit) {
            --result;
            *result = tmp;
            odd_digit = false;
        } else {
            *result |= tmp << 4;
            odd_digit = true;
        }
    }

    res.remove(0, result - (const uchar *)res.constData());
    return res;
}